

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::_::RawSchema_*>::dispose(ArrayBuilder<capnp::_::RawSchema_*> *this)

{
  RawSchema **firstElement;
  RemoveConst<capnp::_::RawSchema_*> *ppRVar1;
  RawSchema **ppRVar2;
  RawSchema **endCopy;
  RawSchema **posCopy;
  RawSchema **ptrCopy;
  ArrayBuilder<capnp::_::RawSchema_*> *this_local;
  
  firstElement = this->ptr;
  ppRVar1 = this->pos;
  ppRVar2 = this->endPtr;
  if (firstElement != (RawSchema **)0x0) {
    this->ptr = (RawSchema **)0x0;
    this->pos = (RemoveConst<capnp::_::RawSchema_*> *)0x0;
    this->endPtr = (RawSchema **)0x0;
    ArrayDisposer::dispose<capnp::_::RawSchema*>
              (this->disposer,firstElement,(long)ppRVar1 - (long)firstElement >> 3,
               (long)ppRVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }